

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_accumulated_member_location
          (CompilerMSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  SPIRType *type;
  size_t sVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uint32_t j;
  uint index;
  int iVar7;
  
  if ((int)CONCAT71(in_register_00000009,strip_array) == 0) {
    pSVar4 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  else {
    pSVar4 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  uVar2 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  for (uVar6 = 0; uVar6 != mbr_idx; uVar6 = uVar6 + 1) {
    type = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,
                      (pSVar4->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar6].id);
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(pSVar4->super_IVariant).self.id,mbr_idx,
                       DecorationLocation);
    if (bVar1) {
      uVar2 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(pSVar4->super_IVariant).self.id,mbr_idx,
                         DecorationLocation);
    }
    iVar7 = type->columns + (uint)(type->columns == 0);
    sVar5 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    if (sVar5 != 0) {
      for (index = 0; index < (uint)sVar5; index = index + 1) {
        uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,index);
        iVar7 = iVar7 * uVar3;
        sVar5 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      }
    }
    uVar2 = uVar2 + iVar7;
  }
  return uVar2;
}

Assistant:

uint32_t CompilerMSL::get_accumulated_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array)
{
	auto &type = strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < mbr_idx; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		// Start counting from any place we have a new location decoration.
		if (has_member_decoration(type.self, mbr_idx, DecorationLocation))
			location = get_member_decoration(type.self, mbr_idx, DecorationLocation);

		uint32_t location_count = 1;

		if (mbr_type.columns > 1)
			location_count = mbr_type.columns;

		if (!mbr_type.array.empty())
			for (uint32_t j = 0; j < uint32_t(mbr_type.array.size()); j++)
				location_count *= to_array_size_literal(mbr_type, j);

		location += location_count;
	}

	return location;
}